

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsnames.c
# Opt level: O2

FT_Error FT_Get_Sfnt_LangTag(FT_Face face,FT_UInt langID,FT_SfntLangTag *alangTag)

{
  ushort *puVar1;
  ushort uVar2;
  long lVar3;
  FT_Memory memory;
  FT_Stream stream;
  FT_Error FVar4;
  void *pvVar5;
  uint uVar6;
  long lVar7;
  FT_Error local_34;
  
  local_34 = 6;
  if (face == (FT_Face)0x0 || alangTag == (FT_SfntLangTag *)0x0) {
    return 6;
  }
  if ((face->face_flags & 8) == 0) {
    return 6;
  }
  if ((short)face[2].num_charmaps != 1) {
    return 8;
  }
  if (langID < 0x8001) {
    return 6;
  }
  if (*(uint *)&face[2].generic.finalizer <= langID - 0x8000) {
    return 6;
  }
  lVar3 = face[2].bbox.xMin;
  lVar7 = (ulong)(langID - 0x8000) * 0x18;
  puVar1 = (ushort *)(lVar3 + lVar7);
  uVar2 = *(ushort *)(lVar3 + lVar7);
  uVar6 = (uint)uVar2;
  if ((ulong)uVar2 != 0) {
    if (*(long *)(puVar1 + 8) != 0) goto LAB_001eeeb2;
    memory = face->memory;
    stream = face->stream;
    pvVar5 = ft_mem_realloc(memory,1,0,(ulong)uVar2,(void *)0x0,&local_34);
    *(void **)(puVar1 + 8) = pvVar5;
    if (local_34 == 0) {
      FVar4 = FT_Stream_Seek(stream,*(FT_ULong *)(puVar1 + 4));
      if ((FVar4 == 0) &&
         (FVar4 = FT_Stream_Read(stream,*(FT_Byte **)(puVar1 + 8),(ulong)*puVar1), FVar4 == 0)) {
        uVar6 = (uint)*puVar1;
        goto LAB_001eeeb2;
      }
      pvVar5 = *(void **)(puVar1 + 8);
    }
    if (pvVar5 != (void *)0x0) {
      (*memory->free)(memory,pvVar5);
    }
    puVar1[8] = 0;
    puVar1[9] = 0;
    puVar1[10] = 0;
    puVar1[0xb] = 0;
    *puVar1 = 0;
  }
  uVar6 = 0;
LAB_001eeeb2:
  alangTag->string = *(FT_Byte **)(puVar1 + 8);
  alangTag->string_len = uVar6;
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Sfnt_LangTag( FT_Face          face,
                       FT_UInt          langID,
                       FT_SfntLangTag  *alangTag )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );


    if ( alangTag && face && FT_IS_SFNT( face ) )
    {
      TT_Face  ttface = (TT_Face)face;


      if ( ttface->name_table.format != 1 )
        return FT_THROW( Invalid_Table );

      if ( langID > 0x8000U                                        &&
           langID - 0x8000U < ttface->name_table.numLangTagRecords )
      {
        TT_LangTag  entry = ttface->name_table.langTags +
                            ( langID - 0x8000U );


        /* load name on demand */
        if ( entry->stringLength > 0 && !entry->string )
        {
          FT_Memory  memory = face->memory;
          FT_Stream  stream = face->stream;


          if ( FT_NEW_ARRAY  ( entry->string, entry->stringLength ) ||
               FT_STREAM_SEEK( entry->stringOffset )                ||
               FT_STREAM_READ( entry->string, entry->stringLength ) )
          {
            FT_FREE( entry->string );
            entry->stringLength = 0;
          }
        }

        alangTag->string     = (FT_Byte*)entry->string;
        alangTag->string_len = entry->stringLength;

        error = FT_Err_Ok;
      }
    }

    return error;
  }